

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall GlobalMemoryAccountant::stop(GlobalMemoryAccountant *this)

{
  UtestShell *pUVar1;
  TestMemoryAllocator *pTVar2;
  long in_RDI;
  UtestShell *in_stack_ffffffffffffff80;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28 [3];
  undefined8 local_10 [2];
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    pUVar1 = UtestShell::getCurrent();
    local_10[0] = 0;
    NormalTestTerminator::NormalTestTerminator((NormalTestTerminator *)in_stack_ffffffffffffff80);
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"GlobalMemoryAccount: Stop called without starting",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2f7,local_10);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x175fbc);
  }
  pTVar2 = getCurrentMallocAllocator();
  if (pTVar2 != *(TestMemoryAllocator **)(in_RDI + 0x18)) {
    pUVar1 = UtestShell::getCurrent();
    local_28[0] = 0;
    NormalTestTerminator::NormalTestTerminator((NormalTestTerminator *)in_stack_ffffffffffffff80);
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalMemoryAccountant: Malloc memory allocator has been changed while accounting for memory"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2fa,local_28);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x176044);
  }
  pTVar2 = getCurrentNewAllocator();
  if (pTVar2 != *(TestMemoryAllocator **)(in_RDI + 0x20)) {
    pUVar1 = UtestShell::getCurrent();
    local_30 = 0;
    NormalTestTerminator::NormalTestTerminator((NormalTestTerminator *)in_stack_ffffffffffffff80);
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalMemoryAccountant: New memory allocator has been changed while accounting for memory"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2fd,&local_30);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1760cc);
  }
  pTVar2 = getCurrentNewArrayAllocator();
  if (pTVar2 != *(TestMemoryAllocator **)(in_RDI + 0x28)) {
    in_stack_ffffffffffffff80 = UtestShell::getCurrent();
    local_38 = 0;
    NormalTestTerminator::NormalTestTerminator((NormalTestTerminator *)in_stack_ffffffffffffff80);
    (*in_stack_ffffffffffffff80->_vptr_UtestShell[0x1a])
              (in_stack_ffffffffffffff80,
               "GlobalMemoryAccountant: New Array memory allocator has been changed while accounting for memory"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x300,&local_38);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x176154);
  }
  restoreMemoryAllocators((GlobalMemoryAccountant *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void GlobalMemoryAccountant::stop()
{
    if (mallocAllocator_ == NULLPTR)
      FAIL("GlobalMemoryAccount: Stop called without starting");

    if (getCurrentMallocAllocator() != mallocAllocator_)
        FAIL("GlobalMemoryAccountant: Malloc memory allocator has been changed while accounting for memory");

    if (getCurrentNewAllocator() != newAllocator_)
        FAIL("GlobalMemoryAccountant: New memory allocator has been changed while accounting for memory");

    if (getCurrentNewArrayAllocator() != newArrayAllocator_)
        FAIL("GlobalMemoryAccountant: New Array memory allocator has been changed while accounting for memory");

    restoreMemoryAllocators();
}